

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringStream.hpp
# Opt level: O0

void __thiscall
Qentem::StringStream<char16_t>::StringStream
          (StringStream<char16_t> *this,StringStream<char16_t> *stream)

{
  SizeT SVar1;
  char16_t *pcVar2;
  size_t in_RCX;
  StringStream<char16_t> *stream_local;
  StringStream<char16_t> *this_local;
  
  this->storage_ = (char16_t *)0x0;
  this->length_ = 0;
  this->capacity_ = 0;
  SVar1 = Length(stream);
  if (SVar1 != 0) {
    SVar1 = Length(stream);
    allocate(this,SVar1);
    pcVar2 = First(stream);
    SVar1 = Length(stream);
    write(this,(int)pcVar2,(void *)(ulong)SVar1,in_RCX);
  }
  return;
}

Assistant:

StringStream(const StringStream &stream) {
        if (stream.Length() != 0) {
            allocate(stream.Length());
            write(stream.First(), stream.Length());
        }
    }